

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_api.cc
# Opt level: O1

string * __thiscall
re2c::InputAPI::stmt_skip_backup_abi_cxx11_
          (string *__return_storage_ptr__,InputAPI *this,uint32_t ind)

{
  size_type *psVar1;
  type_t tVar2;
  undefined8 *puVar3;
  opt_t *poVar4;
  long *plVar5;
  long *plVar6;
  ulong *puVar7;
  int iVar8;
  undefined8 uVar9;
  _Alloc_hider _Var10;
  string local_b0;
  string local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  undefined8 local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  tVar2 = this->type_;
  if (tVar2 == DEFAULT) {
    local_70 = &local_60;
    local_68 = 0;
    local_60._M_local_buf[0] = '\0';
    iVar8 = ind + 1;
    while ((poVar4 = realopt_t::operator->((realopt_t *)&DAT_0015d868), poVar4->target != DOT &&
           (iVar8 = iVar8 + -1, iVar8 != 0))) {
      poVar4 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
      std::__cxx11::string::_M_append((char *)&local_70,(ulong)(poVar4->indString)._M_dataplus._M_p)
      ;
    }
    poVar4 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_70,(ulong)(poVar4->yymarker)._M_dataplus._M_p);
    local_50 = &local_40;
    plVar6 = plVar5 + 2;
    if ((long *)*plVar5 == plVar6) {
      local_40 = *plVar6;
      lStack_38 = plVar5[3];
    }
    else {
      local_40 = *plVar6;
      local_50 = (long *)*plVar5;
    }
    local_48 = plVar5[1];
    *plVar5 = (long)plVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    puVar7 = (ulong *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar7) {
      local_b0.field_2._M_allocated_capacity = *puVar7;
      local_b0.field_2._8_8_ = plVar5[3];
    }
    else {
      local_b0.field_2._M_allocated_capacity = *puVar7;
      local_b0._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_b0._M_string_length = plVar5[1];
    *plVar5 = (long)puVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    poVar4 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_b0,(ulong)(poVar4->yycursor)._M_dataplus._M_p);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    puVar7 = (ulong *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar7) {
      local_90.field_2._M_allocated_capacity = *puVar7;
      local_90.field_2._8_8_ = plVar5[3];
    }
    else {
      local_90.field_2._M_allocated_capacity = *puVar7;
      local_90._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_90._M_string_length = plVar5[1];
    *plVar5 = (long)puVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_90);
  }
  else {
    stmt_skip_abi_cxx11_(&local_90,this,ind);
    stmt_backup_abi_cxx11_(&local_b0,this,ind);
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      uVar9 = local_90.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar9 < local_b0._M_string_length + local_90._M_string_length) {
      uVar9 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        uVar9 = local_b0.field_2._M_allocated_capacity;
      }
      if (local_b0._M_string_length + local_90._M_string_length <= (ulong)uVar9) {
        puVar3 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_b0,0,(char *)0x0,(ulong)local_90._M_dataplus._M_p);
        goto LAB_0012247c;
      }
    }
    puVar3 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_b0._M_dataplus._M_p);
  }
LAB_0012247c:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar3 + 2;
  if ((size_type *)*puVar3 == psVar1) {
    uVar9 = puVar3[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar9;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar3[1];
  *puVar3 = psVar1;
  puVar3[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (tVar2 == DEFAULT) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,local_40 + 1);
    }
    if (local_70 == &local_60) {
      return __return_storage_ptr__;
    }
    uVar9 = CONCAT71(local_60._M_allocated_capacity._1_7_,local_60._M_local_buf[0]);
    _Var10._M_p = (pointer)local_70;
  }
  else {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    uVar9 = local_90.field_2._M_allocated_capacity;
    _Var10._M_p = local_90._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p == &local_90.field_2) {
      return __return_storage_ptr__;
    }
  }
  operator_delete(_Var10._M_p,uVar9 + 1);
  return __return_storage_ptr__;
}

Assistant:

std::string InputAPI::stmt_skip_backup (uint32_t ind) const
{
	return type_ == DEFAULT
		? indent (ind) + opts->yymarker + " = ++" + opts->yycursor + ";\n"
		: stmt_skip (ind) + stmt_backup (ind);
}